

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag>::
storage(storage<baryonyx::itm::default_cost_type<double>,_baryonyx::itm::minimize_tag> *this,
       random_engine *rng,default_cost_type<double> *costs_,double cost_constant_,
       int population_size,int variables,
       vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       *constraints_)

{
  vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
  *this_00;
  bit_array *this_01;
  unsigned_long *puVar1;
  pointer pmVar2;
  pointer pfVar3;
  pointer piVar4;
  pointer piVar5;
  byte bVar6;
  bool bVar7;
  undefined8 uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  int iVar14;
  raw_result<baryonyx::itm::minimize_tag> *elem;
  pointer prVar15;
  pointer prVar16;
  ulong uVar17;
  pointer pfVar18;
  ulong uVar19;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined8 in_XMM3_Qb;
  undefined1 auVar47 [32];
  vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
  *__range3;
  undefined1 local_68 [56];
  undefined1 auVar28 [32];
  undefined1 auVar24 [32];
  
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x20) = 0;
  (this->m_indices_mutex)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x30) = 0;
  (this->m_indices_mutex)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->m_indices_mutex)._M_impl._M_rwlock + 0x18) = 0;
  local_68._16_8_ = cost_constant_;
  local_68._24_8_ = constraints_;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->m_indices,(long)population_size,(allocator_type *)local_68);
  this_00 = &this->m_data;
  std::
  vector<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
  ::vector(this_00,(long)population_size,(allocator_type *)local_68);
  this_01 = &this->m_bastert;
  bit_array_impl::bit_array_impl(&this_01->super_bit_array_impl,variables);
  bit_array_impl::bit_array_impl(&(this->m_random).super_bit_array_impl,variables);
  this->costs = costs_;
  this->cost_constant = (double)local_68._16_8_;
  this->m_size = population_size;
  prVar16 = (this->m_data).
            super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar15 = (this->m_data).
                 super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; prVar15 != prVar16;
      prVar15 = prVar15 + 1) {
    bit_array_impl::bit_array_impl((bit_array_impl *)local_68,variables);
    uVar8 = local_68._8_8_;
    if (prVar15 != (pointer)local_68) {
      (prVar15->x).super_bit_array_impl.m_size = local_68._0_4_;
      (prVar15->x).super_bit_array_impl.m_block_size = local_68._4_4_;
      local_68._8_8_ = (unsigned_long *)0x0;
      puVar1 = (prVar15->x).super_bit_array_impl.m_data._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (prVar15->x).super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = (unsigned_long *)uVar8;
      if (puVar1 != (unsigned_long *)0x0) {
        operator_delete__(puVar1);
      }
    }
    if ((unsigned_long *)local_68._8_8_ != (unsigned_long *)0x0) {
      operator_delete__((void *)local_68._8_8_);
    }
  }
  init_with_bastert<baryonyx::itm::default_cost_type<double>,baryonyx::itm::minimize_tag>
            (this_01,costs_,variables,0);
  uVar11 = this->m_size;
  uVar13 = (int)uVar11 / 2;
  if (2 < uVar11 + 1) {
    uVar20 = 0;
    do {
      bit_array_impl::operator=
                ((bit_array_impl *)
                 ((this_00->
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar20),
                 &this_01->super_bit_array_impl);
      if (variables != 0) {
        auVar44._0_8_ = (double)(int)uVar20 / (double)(int)(uVar13 * 5);
        auVar44._8_8_ = in_XMM3_Qb;
        iVar14 = 0;
        auVar46 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar44);
        uVar8 = vcmpsd_avx512f(auVar44,ZEXT816(0),1);
        local_68._40_8_ = auVar46._8_8_;
        local_68._32_8_ = (ulong)!(bool)((byte)uVar8 & 1) * auVar46._0_8_;
        do {
          dVar43 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (rng);
          if (dVar43 < (double)local_68._32_8_) {
            bit_array_impl::invert
                      ((bit_array_impl *)
                       ((this_00->
                        super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar20),iVar14);
          }
          iVar14 = iVar14 + 1;
        } while (variables != iVar14);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar13);
    uVar11 = this->m_size;
    uVar13 = (int)uVar11 / 2;
  }
  uVar20 = (ulong)(uVar13 + 1);
  if ((int)(uVar13 + 1) < (int)uVar11) {
    lVar21 = (long)(int)uVar13;
    do {
      prVar15 = (this_00->
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_68._32_8_ = lVar21 * 0x38;
      if (variables != 0) {
        iVar14 = 0;
        do {
          dVar43 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (rng);
          if (0.2 <= dVar43) {
            bit_array_impl::unset((bit_array_impl *)(prVar15 + lVar21),iVar14);
          }
          else {
            bit_array_impl::set((bit_array_impl *)(prVar15 + lVar21),iVar14);
          }
          iVar14 = iVar14 + 1;
        } while (variables != iVar14);
        iVar14 = 0;
        prVar15 = (this_00->
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + (int)uVar20;
        do {
          dVar43 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (rng);
          if (0.8 <= dVar43) {
            bit_array_impl::unset((bit_array_impl *)prVar15,iVar14);
          }
          else {
            bit_array_impl::set((bit_array_impl *)prVar15,iVar14);
          }
          iVar14 = iVar14 + 1;
        } while (variables != iVar14);
        prVar15 = (this_00->
                  super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      auVar46._0_8_ = (double)(int)lVar21 / (double)(int)(uVar11 * 5);
      auVar46._8_8_ = in_XMM3_Qb;
      uVar8 = vcmpsd_avx512f(auVar46,ZEXT816(0) << 0x40,1);
      auVar46 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar46);
      init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::minimize_tag>
                ((bit_array *)((long)&(prVar15->x).super_bit_array_impl.m_size + local_68._32_8_),
                 &prVar15[(int)uVar20].x,rng,costs_,
                 (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)local_68._24_8_,(double)((ulong)!(bool)((byte)uVar8 & 1) * auVar46._0_8_));
      uVar22 = lVar21 + 3;
      uVar20 = uVar22 & 0xffffffff;
      lVar21 = lVar21 + 2;
    } while ((long)uVar22 < (long)(int)uVar11);
    uVar11 = this->m_size;
  }
  if (uVar11 != 0) {
    uVar20 = 0;
    prVar15 = (this_00->
              super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar12 = bit_array_hash::operator()((bit_array_hash *)local_68,&prVar15[uVar20].x);
      prVar15[uVar20].hash = sVar12;
      dVar43 = default_cost_type<double>::results
                         (this->costs,
                          &(this->m_data).
                           super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar20].x,
                          (double)local_68._16_8_);
      prVar15 = (this->m_data).
                super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar29 = vpbroadcastq_avx512f(ZEXT816(1));
      auVar47._8_4_ = 0xffffffc0;
      auVar47._0_8_ = 0xffffffc0ffffffc0;
      auVar47._12_4_ = 0xffffffc0;
      auVar47._16_4_ = 0xffffffc0;
      auVar47._20_4_ = 0xffffffc0;
      auVar47._24_4_ = 0xffffffc0;
      auVar47._28_4_ = 0xffffffc0;
      vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      prVar15[uVar20].value = dVar43;
      prVar15[uVar20].remaining_constraints = 0;
      pmVar2 = (((_Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *)local_68._24_8_)->_M_impl).super__Vector_impl_data._M_start;
      uVar22 = ((long)(((_Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                         *)local_68._24_8_)->_M_impl).super__Vector_impl_data._M_finish -
                (long)pmVar2 >> 3) * -0x3333333333333333;
      if ((int)uVar22 != 0) {
        prVar16 = prVar15 + uVar20;
        iVar14 = 0;
        uVar17 = 0;
        do {
          iVar35 = 0;
          pfVar18 = *(pointer *)
                     &pmVar2[uVar17].elements.
                      super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                      ._M_impl;
          pfVar3 = *(pointer *)
                    ((long)&pmVar2[uVar17].elements.
                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                            ._M_impl + 8);
          if (pfVar18 != pfVar3) {
            uVar19 = 0;
            lVar21 = -8 - (long)pfVar18;
            auVar31 = vpbroadcastq_avx512f();
            auVar31 = vpsrlq_avx512f(auVar31,3);
            auVar45 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar32 = vpbroadcastq_avx512f();
              uVar19 = uVar19 + 8;
              auVar32 = vporq_avx512f(auVar32,auVar30);
              uVar9 = vpcmpuq_avx512f(auVar32,auVar31,2);
              auVar24 = vpgatherdd_avx512vl(*(undefined4 *)((long)pfVar18 * 2 + 4));
              bVar6 = (byte)uVar9;
              auVar25._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar24._4_4_;
              auVar25._0_4_ = (uint)(bVar6 & 1) * auVar24._0_4_;
              auVar25._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar24._8_4_;
              auVar25._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar24._12_4_;
              auVar25._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar24._16_4_;
              auVar25._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar24._20_4_;
              auVar25._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar24._24_4_;
              auVar25._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar24._28_4_;
              auVar24 = vpsrad_avx2(auVar25,0x1f);
              auVar24 = vpsrld_avx2(auVar24,0x1a);
              auVar24 = vpaddd_avx2(auVar25,auVar24);
              vpsrad_avx2(auVar24,6);
              auVar24 = vpand_avx2(auVar47,auVar24);
              auVar24 = vpsubd_avx2(auVar25,auVar24);
              auVar32 = vpgatherdq_avx512f(*(undefined4 *)
                                            ((long)(prVar16->x).super_bit_array_impl.m_data._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                                  ._M_t + (long)prVar16 * 8));
              auVar33._8_8_ = (ulong)((byte)(uVar9 >> 1) & 1) * auVar32._8_8_;
              auVar33._0_8_ = (ulong)(bVar6 & 1) * auVar32._0_8_;
              auVar33._16_8_ = (ulong)((byte)(uVar9 >> 2) & 1) * auVar32._16_8_;
              auVar33._24_8_ = (ulong)((byte)(uVar9 >> 3) & 1) * auVar32._24_8_;
              auVar33._32_8_ = (ulong)((byte)(uVar9 >> 4) & 1) * auVar32._32_8_;
              auVar33._40_8_ = (ulong)((byte)(uVar9 >> 5) & 1) * auVar32._40_8_;
              auVar33._48_8_ = (ulong)((byte)(uVar9 >> 6) & 1) * auVar32._48_8_;
              auVar33._56_8_ = (uVar9 >> 7) * auVar32._56_8_;
              auVar32 = vpmovzxdq_avx512f(auVar24);
              auVar32 = vpsrlvq_avx512f(auVar33,auVar32);
              uVar10 = vptestmq_avx512f(auVar32,auVar29);
              auVar24 = vpgatherdd_avx512vl(*(undefined4 *)((long)pfVar18 * 2));
              auVar26._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar24._4_4_;
              auVar26._0_4_ = (uint)(bVar6 & 1) * auVar24._0_4_;
              auVar26._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar24._8_4_;
              auVar26._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar24._12_4_;
              auVar26._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar24._16_4_;
              auVar26._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar24._20_4_;
              auVar26._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar24._24_4_;
              auVar26._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar24._28_4_;
              pfVar18 = pfVar18 + 8;
              auVar24 = vpaddd_avx512vl(auVar45._0_32_,auVar26);
              bVar7 = (bool)((byte)uVar10 & 1);
              iVar35 = auVar45._0_4_;
              auVar27._0_4_ = (uint)bVar7 * auVar24._0_4_ | (uint)!bVar7 * iVar35;
              bVar7 = (bool)((byte)(uVar10 >> 1) & 1);
              iVar36 = auVar45._4_4_;
              auVar27._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * iVar36;
              bVar7 = (bool)((byte)(uVar10 >> 2) & 1);
              iVar37 = auVar45._8_4_;
              auVar27._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * iVar37;
              bVar7 = (bool)((byte)(uVar10 >> 3) & 1);
              iVar38 = auVar45._12_4_;
              auVar27._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * iVar38;
              bVar7 = (bool)((byte)(uVar10 >> 4) & 1);
              iVar39 = auVar45._16_4_;
              auVar27._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * iVar39;
              bVar7 = (bool)((byte)(uVar10 >> 5) & 1);
              iVar40 = auVar45._20_4_;
              auVar27._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * iVar40;
              bVar7 = (bool)((byte)(uVar10 >> 6) & 1);
              iVar41 = auVar45._24_4_;
              auVar27._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * iVar41;
              bVar7 = SUB81(uVar10 >> 7,0);
              iVar42 = auVar45._28_4_;
              auVar27._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * iVar42;
              auVar45 = ZEXT3264(auVar27);
            } while ((((ulong)((long)pfVar3 + lVar21) >> 3) + 8 & 0xfffffffffffffff8) != uVar19);
            auVar24 = vmovdqa32_avx512vl(auVar27);
            auVar23._0_4_ = (uint)(bVar6 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar6 & 1) * iVar35;
            bVar7 = (bool)((byte)(uVar9 >> 1) & 1);
            auVar23._4_4_ = (uint)bVar7 * auVar24._4_4_ | (uint)!bVar7 * iVar36;
            bVar7 = (bool)((byte)(uVar9 >> 2) & 1);
            auVar23._8_4_ = (uint)bVar7 * auVar24._8_4_ | (uint)!bVar7 * iVar37;
            bVar7 = (bool)((byte)(uVar9 >> 3) & 1);
            auVar23._12_4_ = (uint)bVar7 * auVar24._12_4_ | (uint)!bVar7 * iVar38;
            bVar7 = (bool)((byte)(uVar9 >> 4) & 1);
            auVar28._16_4_ = (uint)bVar7 * auVar24._16_4_ | (uint)!bVar7 * iVar39;
            auVar28._0_16_ = auVar23;
            bVar7 = (bool)((byte)(uVar9 >> 5) & 1);
            auVar28._20_4_ = (uint)bVar7 * auVar24._20_4_ | (uint)!bVar7 * iVar40;
            bVar7 = (bool)((byte)(uVar9 >> 6) & 1);
            auVar28._24_4_ = (uint)bVar7 * auVar24._24_4_ | (uint)!bVar7 * iVar41;
            bVar7 = SUB81(uVar9 >> 7,0);
            auVar28._28_4_ = (uint)bVar7 * auVar24._28_4_ | (uint)!bVar7 * iVar42;
            auVar46 = vphaddd_avx(auVar28._16_16_,auVar23);
            auVar46 = vphaddd_avx(auVar46,auVar46);
            auVar46 = vphaddd_avx(auVar46,auVar46);
            iVar35 = auVar46._0_4_;
          }
          if ((iVar35 < pmVar2[uVar17].min) || (pmVar2[uVar17].max < iVar35)) {
            iVar14 = iVar14 + 1;
            prVar16->remaining_constraints = iVar14;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 != (uVar22 & 0xffffffff));
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar11);
  }
  piVar4 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar4 != piVar5) {
    auVar29 = vpmovsxbd_avx512f(_DAT_0062c780);
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar45 = vpbroadcastd_avx512f(ZEXT416(0x10));
    uVar20 = 0;
    auVar32 = vpbroadcastq_avx512f();
    auVar32 = vpsrlq_avx512f(auVar32,2);
    do {
      auVar33 = vpbroadcastq_avx512f();
      auVar34 = vporq_avx512f(auVar33,auVar30);
      auVar33 = vporq_avx512f(auVar33,auVar31);
      vpcmpuq_avx512f(auVar33,auVar32,2);
      vpcmpuq_avx512f(auVar34,auVar32,2);
      auVar33 = vmovdqu32_avx512f(auVar29);
      *(undefined1 (*) [64])(piVar4 + uVar20) = auVar33;
      uVar20 = uVar20 + 0x10;
      auVar29 = vpaddd_avx512f(auVar29,auVar45);
    } while ((((ulong)((long)piVar5 + (-4 - (long)piVar4)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar20);
  }
  sort(this);
  return;
}

Assistant:

storage(random_engine& rng,
            const Cost& costs_,
            const double cost_constant_,
            const int population_size,
            const int variables,
            const std::vector<merged_constraint>& constraints_)
      : m_indices(population_size)
      , m_data(population_size)
      , m_bastert(variables)
      , m_random(variables)
      , costs(costs_)
      , cost_constant(cost_constant_)
      , m_size(population_size)
    {
        for (auto& elem : m_data)
            elem.x = bit_array(variables);

        init_with_bastert<Cost, Mode>(m_bastert, costs_, variables, 0);

        for (int i = 0, e = m_size / 2; i != e; ++i) {
            m_data[i].x = m_bastert;

            std::bernoulli_distribution dist(
              std::clamp(static_cast<double>(i) / (5 * e), 0.0, 1.0));

            for (int v = 0; v != variables; ++v)
                if (dist(rng))
                    m_data[i].x.invert(v);
        }

        for (int i = m_size / 2, e = m_size; i + 1 < e; i += 2) {
            init_with_random(m_data[i].x, rng, variables, 0.2);
            init_with_random(m_data[i + 1].x, rng, variables, 0.8);

            init_with_pre_solve<Cost, Mode>(
              m_data[i].x,
              m_data[i + 1].x,
              rng,
              costs_,
              constraints_,
              std::clamp(static_cast<double>(i) / (5 * e), 0.0, 1.0));
        }

        for (int i = 0, e = m_size; i != e; ++i) {
            m_data[i].make_hash();
            m_data[i].value = costs.results(m_data[i].x, cost_constant_);
            m_data[i].remaining_constraints = 0;

            for (int k = 0, end_k = length(constraints_); k != end_k; ++k) {
                int sum = 0;
                for (const auto& elem : constraints_[k].elements) {
                    if (m_data[i].x[elem.variable_index])
                        sum += elem.factor;
                }

                if (!(constraints_[k].min <= sum &&
                      sum <= constraints_[k].max))
                    ++m_data[i].remaining_constraints;
            }
        }

        std::iota(std::begin(m_indices), std::end(m_indices), 0);

        sort();
    }